

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O2

void Eigen::internal::
     general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_false,_1>
     ::run(long rows,long cols,const_blas_data_mapper<float,_long,_1> *alhs,
          const_blas_data_mapper<float,_long,_1> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *pfVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float *local_c0;
  float *local_b8;
  
  pfVar12 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
  lVar2 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
  local_b8 = pfVar12 + lVar2;
  pfVar11 = pfVar12 + lVar2 * 2;
  pfVar16 = pfVar12 + lVar2 * 3;
  local_c0 = pfVar12;
  for (uVar9 = 0; ((ulong)(lVar2 * 4) < 0x7d01 && ((long)uVar9 < rows + -7)); uVar9 = uVar9 + 8) {
    pfVar17 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
    lVar13 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
    fVar27 = 0.0;
    fVar28 = 0.0;
    fVar29 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
    fVar33 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
    fVar37 = 0.0;
    fVar38 = 0.0;
    fVar19 = 0.0;
    fVar20 = 0.0;
    fVar21 = 0.0;
    fVar22 = 0.0;
    fVar39 = 0.0;
    fVar40 = 0.0;
    fVar41 = 0.0;
    fVar42 = 0.0;
    fVar43 = 0.0;
    fVar44 = 0.0;
    fVar45 = 0.0;
    fVar46 = 0.0;
    fVar47 = 0.0;
    fVar48 = 0.0;
    fVar49 = 0.0;
    fVar50 = 0.0;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar25 = 0.0;
    fVar26 = 0.0;
    lVar8 = 0;
    pfVar7 = local_c0;
    while (lVar8 + 4 <= cols) {
      fVar3 = *pfVar17;
      fVar4 = pfVar17[1];
      fVar5 = pfVar17[2];
      fVar6 = pfVar17[3];
      pfVar10 = local_c0 + lVar8;
      fVar23 = fVar23 + *pfVar10 * fVar3;
      fVar24 = fVar24 + pfVar10[1] * fVar4;
      fVar25 = fVar25 + pfVar10[2] * fVar5;
      fVar26 = fVar26 + pfVar10[3] * fVar6;
      pfVar10 = local_c0 + lVar8 + lVar2;
      fVar47 = fVar47 + *pfVar10 * fVar3;
      fVar48 = fVar48 + pfVar10[1] * fVar4;
      fVar49 = fVar49 + pfVar10[2] * fVar5;
      fVar50 = fVar50 + pfVar10[3] * fVar6;
      pfVar10 = local_c0 + lVar8 + lVar2 * 2;
      fVar43 = fVar43 + *pfVar10 * fVar3;
      fVar44 = fVar44 + pfVar10[1] * fVar4;
      fVar45 = fVar45 + pfVar10[2] * fVar5;
      fVar46 = fVar46 + pfVar10[3] * fVar6;
      pfVar10 = local_c0 + lVar8 + lVar2 * 3;
      fVar39 = fVar39 + *pfVar10 * fVar3;
      fVar40 = fVar40 + pfVar10[1] * fVar4;
      fVar41 = fVar41 + pfVar10[2] * fVar5;
      fVar42 = fVar42 + pfVar10[3] * fVar6;
      pfVar10 = local_c0 + lVar8 + lVar2 * 4;
      fVar19 = fVar19 + *pfVar10 * fVar3;
      fVar20 = fVar20 + pfVar10[1] * fVar4;
      fVar21 = fVar21 + pfVar10[2] * fVar5;
      fVar22 = fVar22 + pfVar10[3] * fVar6;
      pfVar10 = local_c0 + lVar8 + lVar2 * 5;
      fVar35 = fVar35 + *pfVar10 * fVar3;
      fVar36 = fVar36 + pfVar10[1] * fVar4;
      fVar37 = fVar37 + pfVar10[2] * fVar5;
      fVar38 = fVar38 + pfVar10[3] * fVar6;
      pfVar10 = local_c0 + lVar8 + lVar2 * 6;
      pfVar14 = local_c0 + lVar8 + lVar2 * 7;
      fVar31 = fVar31 + *pfVar10 * fVar3;
      fVar32 = fVar32 + pfVar10[1] * fVar4;
      fVar33 = fVar33 + pfVar10[2] * fVar5;
      fVar34 = fVar34 + pfVar10[3] * fVar6;
      fVar27 = fVar27 + *pfVar14 * fVar3;
      fVar28 = fVar28 + pfVar14[1] * fVar4;
      fVar29 = fVar29 + pfVar14[2] * fVar5;
      fVar30 = fVar30 + pfVar14[3] * fVar6;
      pfVar17 = pfVar17 + lVar13 * 4;
      pfVar7 = pfVar7 + 4;
      lVar8 = lVar8 + 4;
    }
    fVar23 = fVar26 + fVar24 + fVar25 + fVar23;
    fVar24 = fVar50 + fVar48 + fVar49 + fVar47;
    fVar25 = fVar46 + fVar44 + fVar45 + fVar43;
    fVar26 = fVar42 + fVar40 + fVar41 + fVar39;
    fVar19 = fVar22 + fVar20 + fVar21 + fVar19;
    fVar20 = fVar38 + fVar36 + fVar37 + fVar35;
    fVar21 = fVar34 + fVar32 + fVar33 + fVar31;
    fVar22 = fVar30 + fVar28 + fVar29 + fVar27;
    for (; lVar8 < cols; lVar8 = lVar8 + 1) {
      fVar27 = *pfVar17;
      fVar19 = fVar19 + pfVar7[lVar2 * 4] * fVar27;
      fVar20 = fVar20 + pfVar7[lVar2 * 5] * fVar27;
      fVar21 = fVar21 + pfVar7[lVar2 * 6] * fVar27;
      fVar22 = fVar22 + pfVar7[lVar2 * 7] * fVar27;
      fVar23 = fVar23 + *pfVar7 * fVar27;
      fVar24 = fVar24 + pfVar7[lVar2] * fVar27;
      fVar25 = fVar25 + pfVar7[lVar2 * 2] * fVar27;
      fVar26 = fVar26 + pfVar7[lVar2 * 3] * fVar27;
      pfVar17 = pfVar17 + lVar13;
      pfVar7 = pfVar7 + 1;
    }
    res[uVar9 * resIncr] = alpha * fVar23 + res[uVar9 * resIncr];
    lVar13 = (uVar9 | 1) * resIncr;
    res[lVar13] = fVar24 * alpha + res[lVar13];
    lVar13 = (uVar9 | 2) * resIncr;
    res[lVar13] = fVar25 * alpha + res[lVar13];
    lVar13 = (uVar9 | 3) * resIncr;
    res[lVar13] = fVar26 * alpha + res[lVar13];
    lVar13 = (uVar9 | 4) * resIncr;
    res[lVar13] = alpha * fVar19 + res[lVar13];
    lVar13 = (uVar9 | 5) * resIncr;
    res[lVar13] = fVar20 * alpha + res[lVar13];
    lVar13 = (uVar9 | 6) * resIncr;
    res[lVar13] = fVar21 * alpha + res[lVar13];
    lVar13 = (uVar9 | 7) * resIncr;
    res[lVar13] = fVar22 * alpha + res[lVar13];
    local_c0 = local_c0 + lVar2 * 8;
    local_b8 = local_b8 + lVar2 * 8;
    pfVar11 = pfVar11 + lVar2 * 8;
    pfVar16 = pfVar16 + lVar2 * 8;
  }
  for (; (long)uVar9 < rows + -3; uVar9 = uVar9 + 4) {
    pfVar17 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
    lVar13 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar25 = 0.0;
    fVar26 = 0.0;
    fVar27 = 0.0;
    fVar28 = 0.0;
    fVar29 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
    fVar33 = 0.0;
    fVar34 = 0.0;
    fVar19 = 0.0;
    fVar20 = 0.0;
    fVar21 = 0.0;
    fVar22 = 0.0;
    pfVar7 = pfVar17;
    pfVar10 = local_c0;
    lVar8 = 0;
    pfVar14 = pfVar11;
    pfVar15 = local_b8;
    pfVar18 = pfVar16;
    while (lVar8 + 4 <= cols) {
      pfVar1 = pfVar17 + lVar13 * lVar8;
      fVar35 = *pfVar1;
      fVar36 = pfVar1[1];
      fVar37 = pfVar1[2];
      fVar38 = pfVar1[3];
      pfVar1 = pfVar12 + uVar9 * lVar2 + lVar8;
      fVar19 = fVar19 + *pfVar1 * fVar35;
      fVar20 = fVar20 + pfVar1[1] * fVar36;
      fVar21 = fVar21 + pfVar1[2] * fVar37;
      fVar22 = fVar22 + pfVar1[3] * fVar38;
      pfVar1 = pfVar12 + (uVar9 | 1) * lVar2 + lVar8;
      fVar31 = fVar31 + *pfVar1 * fVar35;
      fVar32 = fVar32 + pfVar1[1] * fVar36;
      fVar33 = fVar33 + pfVar1[2] * fVar37;
      fVar34 = fVar34 + pfVar1[3] * fVar38;
      pfVar1 = pfVar12 + (uVar9 | 2) * lVar2 + lVar8;
      fVar27 = fVar27 + *pfVar1 * fVar35;
      fVar28 = fVar28 + pfVar1[1] * fVar36;
      fVar29 = fVar29 + pfVar1[2] * fVar37;
      fVar30 = fVar30 + pfVar1[3] * fVar38;
      pfVar1 = pfVar12 + (uVar9 | 3) * lVar2 + lVar8;
      fVar23 = fVar23 + *pfVar1 * fVar35;
      fVar24 = fVar24 + pfVar1[1] * fVar36;
      fVar25 = fVar25 + pfVar1[2] * fVar37;
      fVar26 = fVar26 + pfVar1[3] * fVar38;
      pfVar7 = pfVar7 + lVar13 * 4;
      pfVar10 = pfVar10 + 4;
      pfVar15 = pfVar15 + 4;
      pfVar14 = pfVar14 + 4;
      pfVar18 = pfVar18 + 4;
      lVar8 = lVar8 + 4;
    }
    fVar19 = fVar22 + fVar20 + fVar21 + fVar19;
    fVar20 = fVar34 + fVar32 + fVar33 + fVar31;
    fVar21 = fVar30 + fVar28 + fVar29 + fVar27;
    fVar22 = fVar26 + fVar24 + fVar25 + fVar23;
    for (; lVar8 < cols; lVar8 = lVar8 + 1) {
      fVar23 = *pfVar7;
      fVar19 = fVar19 + *pfVar10 * fVar23;
      fVar20 = fVar20 + *pfVar15 * fVar23;
      fVar21 = fVar21 + *pfVar14 * fVar23;
      fVar22 = fVar22 + *pfVar18 * fVar23;
      pfVar7 = pfVar7 + lVar13;
      pfVar10 = pfVar10 + 1;
      pfVar15 = pfVar15 + 1;
      pfVar14 = pfVar14 + 1;
      pfVar18 = pfVar18 + 1;
    }
    res[uVar9 * resIncr] = alpha * fVar19 + res[uVar9 * resIncr];
    lVar13 = (uVar9 | 1) * resIncr;
    res[lVar13] = fVar20 * alpha + res[lVar13];
    lVar13 = (uVar9 | 2) * resIncr;
    res[lVar13] = fVar21 * alpha + res[lVar13];
    lVar13 = (uVar9 | 3) * resIncr;
    res[lVar13] = fVar22 * alpha + res[lVar13];
    local_c0 = local_c0 + lVar2 * 4;
    local_b8 = local_b8 + lVar2 * 4;
    pfVar11 = pfVar11 + lVar2 * 4;
    pfVar16 = pfVar16 + lVar2 * 4;
  }
  for (; (long)uVar9 < rows + -1; uVar9 = uVar9 + 2) {
    pfVar11 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
    lVar13 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
    fVar19 = 0.0;
    fVar20 = 0.0;
    fVar21 = 0.0;
    fVar22 = 0.0;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar25 = 0.0;
    fVar26 = 0.0;
    pfVar12 = local_b8;
    lVar8 = 0;
    pfVar16 = local_c0;
    while (lVar8 + 4 <= cols) {
      pfVar17 = local_c0 + lVar8;
      fVar19 = fVar19 + *pfVar17 * *pfVar11;
      fVar20 = fVar20 + pfVar17[1] * pfVar11[1];
      fVar21 = fVar21 + pfVar17[2] * pfVar11[2];
      fVar22 = fVar22 + pfVar17[3] * pfVar11[3];
      pfVar17 = local_b8 + lVar8;
      fVar23 = fVar23 + *pfVar17 * *pfVar11;
      fVar24 = fVar24 + pfVar17[1] * pfVar11[1];
      fVar25 = fVar25 + pfVar17[2] * pfVar11[2];
      fVar26 = fVar26 + pfVar17[3] * pfVar11[3];
      pfVar11 = pfVar11 + lVar13 * 4;
      pfVar16 = pfVar16 + 4;
      pfVar12 = pfVar12 + 4;
      lVar8 = lVar8 + 4;
    }
    fVar19 = fVar22 + fVar20 + fVar21 + fVar19;
    fVar20 = fVar26 + fVar24 + fVar25 + fVar23;
    for (; lVar8 < cols; lVar8 = lVar8 + 1) {
      fVar19 = fVar19 + *pfVar16 * *pfVar11;
      fVar20 = fVar20 + *pfVar12 * *pfVar11;
      pfVar11 = pfVar11 + lVar13;
      pfVar16 = pfVar16 + 1;
      pfVar12 = pfVar12 + 1;
    }
    res[uVar9 * resIncr] = alpha * fVar19 + res[uVar9 * resIncr];
    lVar13 = (uVar9 | 1) * resIncr;
    res[lVar13] = fVar20 * alpha + res[lVar13];
    local_c0 = local_c0 + lVar2 * 2;
    local_b8 = local_b8 + lVar2 * 2;
  }
  for (; (long)uVar9 < rows; uVar9 = uVar9 + 1) {
    pfVar11 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
    lVar13 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
    fVar19 = 0.0;
    fVar20 = 0.0;
    fVar21 = 0.0;
    fVar22 = 0.0;
    lVar8 = 0;
    pfVar12 = local_c0;
    while (lVar8 + 4 <= cols) {
      pfVar16 = local_c0 + lVar8;
      fVar19 = fVar19 + *pfVar16 * *pfVar11;
      fVar20 = fVar20 + pfVar16[1] * pfVar11[1];
      fVar21 = fVar21 + pfVar16[2] * pfVar11[2];
      fVar22 = fVar22 + pfVar16[3] * pfVar11[3];
      pfVar11 = pfVar11 + lVar13 * 4;
      pfVar12 = pfVar12 + 4;
      lVar8 = lVar8 + 4;
    }
    fVar19 = fVar22 + fVar20 + fVar21 + fVar19;
    for (; lVar8 < cols; lVar8 = lVar8 + 1) {
      fVar19 = fVar19 + *pfVar12 * *pfVar11;
      pfVar12 = pfVar12 + 1;
      pfVar11 = pfVar11 + lVar13;
    }
    res[uVar9 * resIncr] = fVar19 * alpha + res[uVar9 * resIncr];
    local_c0 = local_c0 + lVar2;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         LhsPacketSizeHalf = HalfTraits::LhsPacketSize,
         LhsPacketSizeQuarter = QuarterTraits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    ResPacketHalf c0_h = pset1<ResPacketHalf>(ResScalar(0));
    ResPacketQuarter c0_q = pset1<ResPacketQuarter>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    if (HasHalf) {
      for(; j+LhsPacketSizeHalf<=cols; j+=LhsPacketSizeHalf)
        {
          RhsPacketHalf b0 = rhs.template load<RhsPacketHalf,Unaligned>(j,0);
          c0_h = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i,j),b0,c0_h);
        }
      cc0 += predux(c0_h);
    }
    if (HasQuarter) {
      for(; j+LhsPacketSizeQuarter<=cols; j+=LhsPacketSizeQuarter)
        {
          RhsPacketQuarter b0 = rhs.template load<RhsPacketQuarter,Unaligned>(j,0);
          c0_q = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i,j),b0,c0_q);
        }
      cc0 += predux(c0_q);
    }
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}